

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cc
# Opt level: O2

void __thiscall wabt::Features::AddOptions(Features *this,OptionParser *parser)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:25:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:25:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"enable-exceptions","Enable Experimental exception handling",
             (NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:26:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:26:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"disable-mutable-globals","Disable Import/export mutable globals",
             (NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:27:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:27:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"disable-saturating-float-to-int","Disable Saturating float-to-int operators",
             (NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:28:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:28:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"disable-sign-extension","Disable Sign-extension operators",
             (NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:29:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:29:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption(parser,"disable-simd","Disable SIMD support",(NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:30:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:30:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"enable-threads","Enable Threading support",(NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:31:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:31:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"enable-function-references","Enable Typed function references",
             (NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:32:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:32:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"disable-multi-value","Disable Multi-value",(NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:33:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:33:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"enable-tail-call","Enable Tail-call support",(NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:34:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:34:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"disable-bulk-memory","Disable Bulk-memory operations",(NullCallback *)&local_38
            );
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:35:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:35:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"disable-reference-types","Disable Reference types (externref)",
             (NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:36:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:36:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"enable-annotations","Enable Custom annotation syntax",(NullCallback *)&local_38
            );
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:37:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:37:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"enable-code-metadata","Enable Code metadata",(NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:38:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:38:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption(parser,"enable-gc","Enable Garbage collection",(NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:39:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:39:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption(parser,"enable-memory64","Enable 64-bit memory",(NullCallback *)&local_38)
  ;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:40:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:40:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"enable-multi-memory","Enable Multi-memory",(NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:41:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:41:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"enable-extended-const","Enable Extended constant expressions",
             (NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:42:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:42:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"enable-relaxed-simd","Enable Relaxed SIMD",(NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:43:1)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/feature.def:43:1)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption
            (parser,"enable-custom-page-sizes","Enable Custom page sizes",(NullCallback *)&local_38)
  ;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/feature.cc:36:21)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/feature.cc:36:21)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  OptionParser::AddOption(parser,"enable-all","Enable all features",(NullCallback *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void Features::AddOptions(OptionParser* parser) {
#define WABT_FEATURE(variable, flag, default_, help)       \
  if (default_ == true) {                                  \
    parser->AddOption("disable-" flag, "Disable " help,    \
                      [this]() { disable_##variable(); }); \
  } else {                                                 \
    parser->AddOption("enable-" flag, "Enable " help,      \
                      [this]() { enable_##variable(); });  \
  }

#include "wabt/feature.def"
#undef WABT_FEATURE
  parser->AddOption("enable-all", "Enable all features",
                    [this]() { EnableAll(); });
}